

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O0

void convolve_2d_sr_ver_8tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  __m128i res_00;
  __m256i res_01;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined8 *puVar41;
  int16_t *src;
  __m256i *palVar42;
  int in_EDX;
  int in_ESI;
  ulong *in_RDI;
  int in_R8D;
  long in_R9;
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  int in_stack_00000008;
  int16_t *s;
  __m256i tt_256_1 [2] [8];
  __m256i ss_256_3 [2] [8];
  __m256i r1 [4];
  __m256i r0 [4];
  __m256i s_256_3 [2] [8];
  int32_t x;
  __m256i tt_256 [8];
  __m256i ss_256_2 [8];
  __m256i r_1 [4];
  __m256i s_256_2 [8];
  __m256i ss_256_1 [8];
  __m256i r [2];
  __m256i s_256_1 [8];
  __m256i res_1;
  __m256i ss_256 [4];
  __m256i s_256 [8];
  __m128i s_64 [8];
  __m256i coeffs_256 [4];
  __m128i res;
  __m128i src56;
  __m128i src45;
  __m128i src34;
  __m128i src23;
  __m128i src12;
  __m128i src01;
  __m128i ss_128 [4];
  __m128i s_32 [8];
  __m128i coeffs_128 [4];
  int32_t y;
  int16_t *im;
  __m256i *in_stack_ffffffffffffe620;
  __m256i *in_stack_ffffffffffffe628;
  __m256i *in_stack_ffffffffffffe630;
  ptrdiff_t in_stack_ffffffffffffe638;
  InterpFilterParams *in_stack_ffffffffffffe640;
  __m128i *in_stack_ffffffffffffe648;
  __m128i *in_stack_ffffffffffffe650;
  __m256i *in_stack_ffffffffffffe658;
  undefined4 in_stack_ffffffffffffe660;
  int32_t in_stack_ffffffffffffe664;
  InterpFilterParams *in_stack_ffffffffffffe668;
  int16_t *in_stack_ffffffffffffe670;
  __m256i *in_stack_ffffffffffffe678;
  __m256i *in_stack_ffffffffffffe680;
  __m128i *in_stack_ffffffffffffe688;
  int16_t *in_stack_ffffffffffffe690;
  __m256i *in_stack_ffffffffffffe718;
  __m256i *in_stack_ffffffffffffe720;
  __m256i *in_stack_ffffffffffffe728;
  __m256i *in_stack_ffffffffffffe730;
  __m256i *in_stack_ffffffffffffe738;
  __m256i *in_stack_ffffffffffffe740;
  ptrdiff_t in_stack_ffffffffffffe748;
  int16_t *in_stack_ffffffffffffe750;
  undefined8 local_17c0 [12];
  undefined1 local_1760 [32];
  undefined1 local_16e0 [32];
  undefined8 local_16c0 [12];
  undefined1 local_1660 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [128];
  undefined1 local_1540 [128];
  longlong local_14c0 [24];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  longlong local_13c0 [24];
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  int local_12a4;
  undefined8 local_12a0 [12];
  undefined1 local_1240 [32];
  undefined1 local_11c0 [32];
  undefined8 local_11a0 [12];
  undefined1 local_1140 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [128];
  longlong local_1020 [24];
  ulong local_f60;
  ulong uStack_f58;
  ulong uStack_f50;
  ulong uStack_f48;
  ulong local_f40;
  ulong uStack_f38;
  ulong uStack_f30;
  ulong uStack_f28;
  ulong local_de0;
  ulong uStack_dd8;
  ulong uStack_dd0;
  ulong uStack_dc8;
  ulong local_dc0;
  ulong uStack_db8;
  ulong uStack_db0;
  ulong uStack_da8;
  ulong local_da0;
  ulong uStack_d98;
  ulong uStack_d90;
  ulong uStack_d88;
  ulong local_d80;
  ulong uStack_d78;
  ulong uStack_d70;
  ulong uStack_d68;
  ulong local_d60;
  ulong uStack_d58;
  ulong uStack_d50;
  ulong uStack_d48;
  ulong local_d40;
  ulong uStack_d38;
  ulong uStack_d30;
  ulong uStack_d28;
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  ulong local_c40;
  undefined8 uStack_c38;
  ulong uStack_c30;
  undefined8 uStack_c28;
  ulong local_c20;
  undefined8 uStack_c18;
  ulong uStack_c10;
  undefined8 uStack_c08;
  ulong local_c00;
  undefined8 uStack_bf8;
  ulong uStack_bf0;
  undefined8 uStack_be8;
  ulong local_be0;
  undefined8 uStack_bd8;
  ulong uStack_bd0;
  undefined8 uStack_bc8;
  ulong local_bc0;
  undefined8 uStack_bb8;
  ulong uStack_bb0;
  undefined8 uStack_ba8;
  ulong local_ba0;
  undefined8 uStack_b98;
  ulong uStack_b90;
  undefined8 uStack_b88;
  ulong local_b40;
  undefined8 uStack_b38;
  ulong local_b30;
  undefined8 uStack_b28;
  ulong local_b20;
  undefined8 uStack_b18;
  ulong local_b10;
  undefined8 uStack_b08;
  ulong local_b00;
  undefined8 uStack_af8;
  ulong local_af0;
  undefined8 uStack_ae8;
  ulong local_ae0;
  undefined8 uStack_ad8;
  longlong local_ac0 [18];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  ulong local_980;
  undefined8 uStack_978;
  ulong local_970;
  undefined8 uStack_968;
  ulong local_960;
  undefined8 uStack_958;
  ulong local_950;
  undefined8 uStack_948;
  ulong local_940;
  undefined8 uStack_938;
  ulong local_930;
  undefined8 uStack_928;
  ulong local_920;
  undefined8 uStack_918;
  int local_8b4;
  ulong *local_8b0;
  long local_8a8;
  int local_89c;
  int local_890;
  int local_88c;
  undefined1 local_880 [16];
  uint local_864;
  undefined1 local_860 [16];
  uint local_844;
  undefined1 local_840 [16];
  uint local_824;
  undefined1 local_820 [16];
  uint local_804;
  undefined1 local_800 [16];
  uint local_7e4;
  undefined1 local_7e0 [16];
  uint local_7c4;
  undefined1 local_7c0 [16];
  uint local_7a4;
  ulong local_7a0;
  undefined8 uStack_798;
  ulong local_790;
  undefined8 uStack_788;
  ulong local_780;
  undefined8 uStack_778;
  ulong local_770;
  undefined8 uStack_768;
  ulong local_760;
  undefined8 uStack_758;
  ulong local_750;
  undefined8 uStack_748;
  ulong local_740;
  undefined8 uStack_738;
  ulong uStack_730;
  undefined8 uStack_728;
  ulong local_720;
  undefined8 uStack_718;
  ulong uStack_710;
  undefined8 uStack_708;
  ulong local_700;
  undefined8 uStack_6f8;
  ulong uStack_6f0;
  undefined8 uStack_6e8;
  ulong local_6e0;
  undefined8 uStack_6d8;
  ulong uStack_6d0;
  undefined8 uStack_6c8;
  ulong local_6c0;
  undefined8 uStack_6b8;
  ulong uStack_6b0;
  undefined8 uStack_6a8;
  ulong local_6a0;
  undefined8 uStack_698;
  ulong uStack_690;
  undefined8 uStack_688;
  ulong *local_670;
  ulong *local_668;
  ulong *local_660;
  ulong *local_658;
  ulong *local_650;
  ulong *local_648;
  ulong local_640;
  undefined8 uStack_638;
  ulong *local_628;
  ulong local_620;
  undefined8 uStack_618;
  ulong *local_608;
  ulong local_600;
  undefined8 uStack_5f8;
  ulong *local_5e8;
  ulong local_5e0;
  undefined8 uStack_5d8;
  ulong *local_5c8;
  ulong local_5c0;
  undefined8 uStack_5b8;
  ulong *local_5a8;
  ulong local_5a0;
  undefined8 uStack_598;
  ulong *local_588;
  ulong local_580;
  undefined8 uStack_578;
  ulong *local_568;
  ulong local_560;
  undefined8 uStack_558;
  ulong local_550;
  undefined8 uStack_548;
  ulong local_540;
  undefined8 uStack_538;
  ulong local_530;
  undefined8 uStack_528;
  ulong local_520;
  undefined8 uStack_518;
  ulong local_510;
  undefined8 uStack_508;
  ulong local_500;
  undefined8 uStack_4f8;
  ulong local_4f0;
  undefined8 uStack_4e8;
  ulong local_4e0;
  undefined8 uStack_4d8;
  ulong local_4d0;
  undefined8 uStack_4c8;
  ulong local_4c0;
  undefined8 uStack_4b8;
  ulong local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 *local_438;
  undefined8 *local_430;
  undefined8 *local_428;
  longlong *local_420;
  __m256i *local_418;
  long local_410;
  int16_t *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 (*local_2e8) [32];
  int16_t *local_2e0;
  undefined1 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  longlong *local_2c0;
  __m256i *local_2b8;
  long local_2b0;
  int16_t *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 (*local_188) [32];
  int16_t *local_180;
  undefined1 *local_178;
  undefined8 *local_170;
  undefined8 *local_168;
  longlong *local_160;
  longlong *local_158;
  undefined8 local_150;
  ulong *local_148;
  ulong local_140;
  ulong uStack_138;
  ulong uStack_130;
  ulong uStack_128;
  ulong local_120;
  ulong uStack_118;
  ulong uStack_110;
  ulong uStack_108;
  ulong local_100;
  ulong uStack_f8;
  ulong uStack_f0;
  ulong uStack_e8;
  ulong local_c0;
  ulong uStack_b8;
  ulong uStack_b0;
  ulong uStack_a8;
  ulong local_a0;
  ulong uStack_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong local_80;
  ulong uStack_78;
  ulong uStack_70;
  ulong uStack_68;
  undefined1 (*local_40) [32];
  ulong *local_38;
  
  local_8b0 = in_RDI;
  local_8a8 = in_R9;
  local_890 = in_EDX;
  if (in_ESI == 2) {
    prepare_coeffs_8tap_sse2
              (in_stack_ffffffffffffe640,(int32_t)((ulong)in_stack_ffffffffffffe638 >> 0x20),
               (__m128i *)in_stack_ffffffffffffe630);
    local_7a4 = (uint)*local_8b0;
    local_7c0._4_4_ = 0;
    local_7c0._0_4_ = local_7a4;
    local_980 = local_7c0._0_8_;
    uStack_978 = 0;
    local_7c4 = *(uint *)((long)local_8b0 + 4);
    local_7e0._4_4_ = 0;
    local_7e0._0_4_ = local_7c4;
    local_970 = local_7e0._0_8_;
    uStack_968 = 0;
    local_7e4 = (uint)local_8b0[1];
    local_800._4_4_ = 0;
    local_800._0_4_ = local_7e4;
    local_960 = local_800._0_8_;
    uStack_958 = 0;
    local_804 = *(uint *)((long)local_8b0 + 0xc);
    local_820._4_4_ = 0;
    local_820._0_4_ = local_804;
    local_950 = local_820._0_8_;
    uStack_948 = 0;
    local_824 = (uint)local_8b0[2];
    local_840._4_4_ = 0;
    local_840._0_4_ = local_824;
    local_940 = local_840._0_8_;
    uStack_938 = 0;
    local_844 = *(uint *)((long)local_8b0 + 0x14);
    local_860._4_4_ = 0;
    local_860._0_4_ = local_844;
    local_930 = local_860._0_8_;
    uStack_928 = 0;
    local_864 = (uint)local_8b0[3];
    local_880._4_4_ = 0;
    local_880._0_4_ = local_864;
    local_920 = local_880._0_8_;
    uStack_918 = 0;
    local_4b0 = local_7c0._0_8_;
    uStack_4a8 = 0;
    local_4c0 = local_7e0._0_8_;
    uStack_4b8 = 0;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_7c0._0_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_7e0._0_8_;
    local_9d0 = vpunpckldq_avx(auVar20,auVar19);
    local_4d0 = local_7e0._0_8_;
    uStack_4c8 = 0;
    local_4e0 = local_800._0_8_;
    uStack_4d8 = 0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_7e0._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_800._0_8_;
    local_9e0 = vpunpckldq_avx(auVar18,auVar17);
    local_4f0 = local_800._0_8_;
    uStack_4e8 = 0;
    local_500 = local_820._0_8_;
    uStack_4f8 = 0;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_800._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_820._0_8_;
    local_9f0 = vpunpckldq_avx(auVar16,auVar15);
    local_510 = local_820._0_8_;
    uStack_508 = 0;
    local_520 = local_840._0_8_;
    uStack_518 = 0;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_820._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_840._0_8_;
    local_a00 = vpunpckldq_avx(auVar14,auVar13);
    local_530 = local_840._0_8_;
    uStack_528 = 0;
    local_540 = local_860._0_8_;
    uStack_538 = 0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_840._0_8_;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_860._0_8_;
    local_a10 = vpunpckldq_avx(auVar12,auVar11);
    local_550 = local_860._0_8_;
    uStack_548 = 0;
    local_560 = local_880._0_8_;
    uStack_558 = 0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_860._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_880._0_8_;
    local_a20 = vpunpckldq_avx(auVar10,auVar43);
    local_450 = local_9d0._0_8_;
    uStack_448 = local_9d0._8_8_;
    local_460 = local_9e0._0_8_;
    uStack_458 = local_9e0._8_8_;
    local_9c0 = vpunpcklwd_avx(local_9d0,local_9e0);
    local_470 = local_9f0._0_8_;
    uStack_468 = local_9f0._8_8_;
    local_480 = local_a00._0_8_;
    uStack_478 = local_a00._8_8_;
    local_9b0 = vpunpcklwd_avx(local_9f0,local_a00);
    local_490 = local_a10._0_8_;
    uStack_488 = local_a10._8_8_;
    local_4a0 = local_a20._0_8_;
    uStack_498 = local_a20._8_8_;
    local_9a0 = vpunpcklwd_avx(local_a10,local_a20);
    auVar45 = ZEXT1664(local_9a0);
    local_8b4 = local_890;
    local_880 = ZEXT416(local_864);
    local_860 = ZEXT416(local_844);
    local_840 = ZEXT416(local_824);
    local_820 = ZEXT416(local_804);
    local_800 = ZEXT416(local_7e4);
    local_7e0 = ZEXT416(local_7c4);
    local_7c0 = ZEXT416(local_7a4);
    do {
      auVar43 = auVar45._0_16_;
      xy_y_convolve_8tap_2x2_sse2
                ((int16_t *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                 (__m128i *)in_stack_ffffffffffffe658,in_stack_ffffffffffffe650,
                 in_stack_ffffffffffffe648);
      auVar45 = ZEXT1664(auVar43);
      res_00[1] = (longlong)in_stack_ffffffffffffe650;
      res_00[0] = (longlong)in_stack_ffffffffffffe648;
      local_a30 = auVar43;
      xy_y_round_store_2x2_sse2
                (res_00,(uint8_t *)in_stack_ffffffffffffe640,in_stack_ffffffffffffe638);
      local_8b0 = local_8b0 + 1;
      local_8a8 = local_8a8 + (in_stack_00000008 << 1);
      local_8b4 = local_8b4 + -2;
    } while (local_8b4 != 0);
  }
  else {
    local_89c = in_R8D;
    local_88c = in_ESI;
    prepare_coeffs_8tap_avx2
              (in_stack_ffffffffffffe668,in_stack_ffffffffffffe664,in_stack_ffffffffffffe658);
    if (local_88c == 4) {
      local_568 = local_8b0;
      local_c40 = *local_8b0;
      uStack_578 = 0;
      uStack_b38 = 0;
      local_588 = local_8b0 + 1;
      uStack_c30 = *local_588;
      uStack_598 = 0;
      uStack_b28 = 0;
      local_5a8 = local_8b0 + 2;
      uStack_c10 = *local_5a8;
      uStack_5b8 = 0;
      uStack_b18 = 0;
      local_5c8 = local_8b0 + 3;
      uStack_bf0 = *local_5c8;
      uStack_5d8 = 0;
      uStack_b08 = 0;
      local_5e8 = local_8b0 + 4;
      uStack_bd0 = *local_5e8;
      uStack_5f8 = 0;
      uStack_af8 = 0;
      local_608 = local_8b0 + 5;
      uStack_bb0 = *local_608;
      uStack_618 = 0;
      uStack_ae8 = 0;
      local_628 = local_8b0 + 6;
      uStack_b90 = *local_628;
      uStack_638 = 0;
      uStack_ad8 = 0;
      uStack_748 = 0;
      uStack_c28 = 0;
      uStack_c38 = 0;
      uStack_758 = 0;
      uStack_c08 = 0;
      uStack_c18 = 0;
      uStack_768 = 0;
      uStack_be8 = 0;
      uStack_bf8 = 0;
      uStack_778 = 0;
      uStack_bc8 = 0;
      uStack_bd8 = 0;
      uStack_788 = 0;
      uStack_ba8 = 0;
      uStack_bb8 = 0;
      uStack_798 = 0;
      uStack_b88 = 0;
      uStack_b98 = 0;
      uStack_698 = 0;
      uStack_688 = 0;
      uStack_6b8 = 0;
      uStack_6a8 = 0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_c40;
      auVar9._16_8_ = uStack_c30;
      auVar9._24_8_ = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uStack_c30;
      auVar8._16_8_ = uStack_c10;
      auVar8._24_8_ = 0;
      local_cc0 = vpunpcklwd_avx2(auVar9,auVar8);
      uStack_6d8 = 0;
      uStack_6c8 = 0;
      uStack_6f8 = 0;
      uStack_6e8 = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uStack_c10;
      auVar7._16_8_ = uStack_bf0;
      auVar7._24_8_ = 0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uStack_bf0;
      auVar6._16_8_ = uStack_bd0;
      auVar6._24_8_ = 0;
      local_ca0 = vpunpcklwd_avx2(auVar7,auVar6);
      uStack_718 = 0;
      uStack_708 = 0;
      uStack_738 = 0;
      uStack_728 = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uStack_bd0;
      auVar5._16_8_ = uStack_bb0;
      auVar5._24_8_ = 0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uStack_bb0;
      auVar4._16_8_ = uStack_b90;
      auVar4._24_8_ = 0;
      local_c80 = vpunpcklwd_avx2(auVar5,auVar4);
      auVar45 = ZEXT3264(local_c80);
      local_8b4 = local_890;
      local_c20 = uStack_c30;
      local_c00 = uStack_c10;
      local_be0 = uStack_bf0;
      local_bc0 = uStack_bd0;
      local_ba0 = uStack_bb0;
      local_b40 = local_c40;
      local_b30 = uStack_c30;
      local_b20 = uStack_c10;
      local_b10 = uStack_bf0;
      local_b00 = uStack_bd0;
      local_af0 = uStack_bb0;
      local_ae0 = uStack_b90;
      local_7a0 = uStack_bb0;
      local_790 = uStack_bd0;
      local_780 = uStack_bf0;
      local_770 = uStack_c10;
      local_760 = uStack_c30;
      local_750 = local_c40;
      local_740 = uStack_bb0;
      uStack_730 = uStack_b90;
      local_720 = uStack_bd0;
      uStack_710 = uStack_bb0;
      local_700 = uStack_bf0;
      uStack_6f0 = uStack_bd0;
      local_6e0 = uStack_c10;
      uStack_6d0 = uStack_bf0;
      local_6c0 = uStack_c30;
      uStack_6b0 = uStack_c10;
      local_6a0 = local_c40;
      uStack_690 = uStack_c30;
      local_640 = uStack_b90;
      local_620 = uStack_bb0;
      local_600 = uStack_bd0;
      local_5e0 = uStack_bf0;
      local_5c0 = uStack_c10;
      local_5a0 = uStack_c30;
      local_580 = local_c40;
      do {
        auVar44 = auVar45._0_32_;
        xy_y_convolve_8tap_4x2_avx2
                  (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,in_stack_ffffffffffffe680,
                   in_stack_ffffffffffffe678);
        auVar45 = ZEXT3264(auVar44);
        res_01[1] = (longlong)in_stack_ffffffffffffe680;
        res_01[0] = (longlong)in_stack_ffffffffffffe678;
        res_01[2] = (longlong)in_stack_ffffffffffffe688;
        res_01[3] = (longlong)in_stack_ffffffffffffe690;
        local_ce0 = auVar44;
        xy_y_round_store_4x2_avx2
                  (res_01,(uint8_t *)in_stack_ffffffffffffe670,(ptrdiff_t)in_stack_ffffffffffffe668)
        ;
        local_8b0 = local_8b0 + 2;
        local_8a8 = local_8a8 + (in_stack_00000008 << 1);
        local_8b4 = local_8b4 + -2;
      } while (local_8b4 != 0);
    }
    else if (local_88c == 8) {
      local_648 = local_8b0;
      local_de0 = *local_8b0;
      uStack_dd8 = local_8b0[1];
      uStack_dd0 = local_8b0[2];
      uStack_dc8 = local_8b0[3];
      local_650 = local_8b0 + 2;
      local_dc0 = *local_650;
      uStack_db8 = local_8b0[3];
      uStack_db0 = local_8b0[4];
      uStack_da8 = local_8b0[5];
      local_658 = local_8b0 + 4;
      local_da0 = *local_658;
      uStack_d98 = local_8b0[5];
      uStack_d90 = local_8b0[6];
      uStack_d88 = local_8b0[7];
      local_660 = local_8b0 + 6;
      local_d80 = *local_660;
      uStack_d78 = local_8b0[7];
      uStack_d70 = local_8b0[8];
      uStack_d68 = local_8b0[9];
      local_668 = local_8b0 + 8;
      local_d60 = *local_668;
      uStack_d58 = local_8b0[9];
      uStack_d50 = local_8b0[10];
      uStack_d48 = local_8b0[0xb];
      local_670 = local_8b0 + 10;
      local_d40 = *local_670;
      uStack_d38 = local_8b0[0xb];
      uStack_d30 = local_8b0[0xc];
      uStack_d28 = local_8b0[0xd];
      local_8b4 = local_890;
      if (local_89c == 8) {
        do {
          xy_y_convolve_8tap_8x2_half_pel_avx2
                    ((int16_t *)in_stack_ffffffffffffe730,in_stack_ffffffffffffe728,
                     in_stack_ffffffffffffe720,in_stack_ffffffffffffe718);
          xy_y_round_store_8x2_avx2
                    ((__m256i *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     (uint8_t *)in_stack_ffffffffffffe658,(ptrdiff_t)in_stack_ffffffffffffe650);
          local_8b0 = local_8b0 + 4;
          local_8a8 = local_8a8 + (in_stack_00000008 << 1);
          local_8b4 = local_8b4 + -2;
        } while (local_8b4 != 0);
      }
      else {
        convolve_8tap_unpack_avx2(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628);
        do {
          xy_y_convolve_8tap_8x2_avx2
                    (in_stack_ffffffffffffe670,(__m256i *)in_stack_ffffffffffffe668,
                     (__m256i *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     in_stack_ffffffffffffe658);
          xy_y_round_store_8x2_avx2
                    ((__m256i *)CONCAT44(in_stack_ffffffffffffe664,in_stack_ffffffffffffe660),
                     (uint8_t *)in_stack_ffffffffffffe658,(ptrdiff_t)in_stack_ffffffffffffe650);
          local_8b0 = local_8b0 + 4;
          local_8a8 = local_8a8 + (in_stack_00000008 << 1);
          local_8b4 = local_8b4 + -2;
        } while (local_8b4 != 0);
      }
    }
    else if (local_88c == 0x10) {
      load_16bit_7rows_avx2((int16_t *)local_8b0,0x10,(__m256i *)local_1020);
      local_8b4 = local_890;
      if (local_89c == 8) {
        do {
          xy_y_convolve_8tap_16x2_half_pel_avx2
                    (in_stack_ffffffffffffe750,in_stack_ffffffffffffe748,in_stack_ffffffffffffe740,
                     in_stack_ffffffffffffe738,in_stack_ffffffffffffe730);
          xy_y_round_store_16x2_avx2
                    (in_stack_ffffffffffffe680,(uint8_t *)in_stack_ffffffffffffe678,
                     (ptrdiff_t)in_stack_ffffffffffffe670);
          local_8b0 = local_8b0 + 8;
          local_8a8 = local_8a8 + (in_stack_00000008 << 1);
          local_8b4 = local_8b4 + -2;
        } while (local_8b4 != 0);
      }
      else {
        convolve_8tap_unpack_avx2(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628);
        convolve_8tap_unpack_avx2(in_stack_ffffffffffffe630,in_stack_ffffffffffffe628);
        do {
          local_148 = local_8b0;
          local_150 = 0x10;
          local_158 = local_ac0;
          local_160 = local_1020;
          local_168 = local_11a0;
          local_170 = local_12a0;
          local_178 = local_10a0;
          local_38 = local_8b0 + 0x1c;
          auVar24._8_8_ = uStack_f58;
          auVar24._0_8_ = local_f60;
          auVar24._16_8_ = uStack_f50;
          auVar24._24_8_ = uStack_f48;
          local_100 = local_f40;
          uStack_f8 = uStack_f38;
          uStack_f0 = uStack_f30;
          uStack_e8 = uStack_f28;
          auVar25._8_8_ = uStack_f38;
          auVar25._0_8_ = local_f40;
          auVar25._16_8_ = uStack_f30;
          auVar25._24_8_ = uStack_f28;
          local_1140 = vpunpcklwd_avx2(auVar24,auVar25);
          auVar30._8_8_ = uStack_f58;
          auVar30._0_8_ = local_f60;
          auVar30._16_8_ = uStack_f50;
          auVar30._24_8_ = uStack_f48;
          local_80 = local_f40;
          uStack_78 = uStack_f38;
          uStack_70 = uStack_f30;
          uStack_68 = uStack_f28;
          auVar31._8_8_ = uStack_f38;
          auVar31._0_8_ = local_f40;
          auVar31._16_8_ = uStack_f30;
          auVar31._24_8_ = uStack_f28;
          local_10c0 = vpunpckhwd_avx2(auVar30,auVar31);
          local_40 = (undefined1 (*) [32])(local_8b0 + 0x20);
          local_140 = *(ulong *)*local_40;
          uStack_138 = local_8b0[0x21];
          uStack_130 = local_8b0[0x22];
          uStack_128 = local_8b0[0x23];
          local_120 = local_f40;
          uStack_118 = uStack_f38;
          uStack_110 = uStack_f30;
          uStack_108 = uStack_f28;
          auVar34._8_8_ = uStack_f38;
          auVar34._0_8_ = local_f40;
          auVar34._16_8_ = uStack_f30;
          auVar34._24_8_ = uStack_f28;
          local_1240 = vpunpcklwd_avx2(auVar34,*local_40);
          local_c0 = local_f60;
          uStack_b8 = uStack_f58;
          uStack_b0 = uStack_f50;
          uStack_a8 = uStack_f48;
          auVar39._8_8_ = uStack_f58;
          auVar39._0_8_ = local_f60;
          auVar39._16_8_ = uStack_f50;
          auVar39._24_8_ = uStack_f48;
          local_a0 = local_f40;
          uStack_98 = uStack_f38;
          uStack_90 = uStack_f30;
          uStack_88 = uStack_f28;
          auVar40._8_8_ = uStack_f38;
          auVar40._0_8_ = local_f40;
          auVar40._16_8_ = uStack_f30;
          auVar40._24_8_ = uStack_f28;
          local_11c0 = vpunpckhwd_avx2(auVar40,auVar39);
          local_f40 = *local_38;
          uStack_f38 = local_8b0[0x1d];
          uStack_f30 = local_8b0[0x1e];
          uStack_f28 = local_8b0[0x1f];
          local_f60 = local_140;
          uStack_f58 = uStack_138;
          uStack_f50 = uStack_130;
          uStack_f48 = uStack_128;
          xy_y_convolve_8tap_16_avx2
                    (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,(__m256i *)0x9b0374);
          xy_y_convolve_8tap_16_avx2
                    (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,(__m256i *)0x9b0395);
          puVar41 = local_168;
          puVar1 = local_168 + 5;
          uVar2 = local_168[6];
          uVar3 = local_168[7];
          *local_168 = local_168[4];
          puVar41[1] = *puVar1;
          puVar41[2] = uVar2;
          puVar41[3] = uVar3;
          puVar41 = local_168;
          puVar1 = local_168 + 9;
          uVar2 = local_168[10];
          uVar3 = local_168[0xb];
          local_168[4] = local_168[8];
          puVar41[5] = *puVar1;
          puVar41[6] = uVar2;
          puVar41[7] = uVar3;
          puVar41 = local_168;
          puVar1 = local_168 + 0xd;
          uVar2 = local_168[0xe];
          uVar3 = local_168[0xf];
          local_168[8] = local_168[0xc];
          puVar41[9] = *puVar1;
          puVar41[10] = uVar2;
          puVar41[0xb] = uVar3;
          puVar41 = local_168;
          puVar1 = local_168 + 0x15;
          uVar2 = local_168[0x16];
          uVar3 = local_168[0x17];
          local_168[0x10] = local_168[0x14];
          puVar41[0x11] = *puVar1;
          puVar41[0x12] = uVar2;
          puVar41[0x13] = uVar3;
          puVar41 = local_168;
          puVar1 = local_168 + 0x19;
          uVar2 = local_168[0x1a];
          uVar3 = local_168[0x1b];
          local_168[0x14] = local_168[0x18];
          puVar41[0x15] = *puVar1;
          puVar41[0x16] = uVar2;
          puVar41[0x17] = uVar3;
          puVar41 = local_168;
          puVar1 = local_168 + 0x1d;
          uVar2 = local_168[0x1e];
          uVar3 = local_168[0x1f];
          local_168[0x18] = local_168[0x1c];
          puVar41[0x19] = *puVar1;
          puVar41[0x1a] = uVar2;
          puVar41[0x1b] = uVar3;
          puVar41 = local_170;
          puVar1 = local_170 + 5;
          uVar2 = local_170[6];
          uVar3 = local_170[7];
          *local_170 = local_170[4];
          puVar41[1] = *puVar1;
          puVar41[2] = uVar2;
          puVar41[3] = uVar3;
          puVar41 = local_170;
          puVar1 = local_170 + 9;
          uVar2 = local_170[10];
          uVar3 = local_170[0xb];
          local_170[4] = local_170[8];
          puVar41[5] = *puVar1;
          puVar41[6] = uVar2;
          puVar41[7] = uVar3;
          puVar41 = local_170;
          puVar1 = local_170 + 0xd;
          uVar2 = local_170[0xe];
          uVar3 = local_170[0xf];
          local_170[8] = local_170[0xc];
          puVar41[9] = *puVar1;
          puVar41[10] = uVar2;
          puVar41[0xb] = uVar3;
          puVar41 = local_170;
          puVar1 = local_170 + 0x15;
          uVar2 = local_170[0x16];
          uVar3 = local_170[0x17];
          local_170[0x10] = local_170[0x14];
          puVar41[0x11] = *puVar1;
          puVar41[0x12] = uVar2;
          puVar41[0x13] = uVar3;
          puVar41 = local_170;
          puVar1 = local_170 + 0x19;
          uVar2 = local_170[0x1a];
          uVar3 = local_170[0x1b];
          local_170[0x14] = local_170[0x18];
          puVar41[0x15] = *puVar1;
          puVar41[0x16] = uVar2;
          puVar41[0x17] = uVar3;
          puVar41 = local_170;
          puVar1 = local_170 + 0x1d;
          uVar2 = local_170[0x1e];
          uVar3 = local_170[0x1f];
          local_170[0x18] = local_170[0x1c];
          puVar41[0x19] = *puVar1;
          puVar41[0x1a] = uVar2;
          puVar41[0x1b] = uVar3;
          xy_y_round_store_16x2_avx2
                    (in_stack_ffffffffffffe680,(uint8_t *)in_stack_ffffffffffffe678,
                     (ptrdiff_t)in_stack_ffffffffffffe670);
          local_8b0 = local_8b0 + 8;
          local_8a8 = local_8a8 + (in_stack_00000008 << 1);
          local_8b4 = local_8b4 + -2;
        } while (local_8b4 != 0);
      }
    }
    else {
      local_12a4 = 0;
      do {
        src = (int16_t *)((long)local_8b0 + (long)local_12a4 * 2);
        palVar42 = (__m256i *)(local_8a8 + local_12a4);
        load_16bit_7rows_avx2(src,(long)local_88c,(__m256i *)local_14c0);
        convolve_8tap_unpack_avx2(palVar42,in_stack_ffffffffffffe628);
        convolve_8tap_unpack_avx2(palVar42,in_stack_ffffffffffffe628);
        load_16bit_7rows_avx2(src + 0x10,(long)local_88c,(__m256i *)local_13c0);
        convolve_8tap_unpack_avx2(palVar42,in_stack_ffffffffffffe628);
        convolve_8tap_unpack_avx2(palVar42,in_stack_ffffffffffffe628);
        local_8b4 = local_890;
        do {
          local_2b0 = (long)local_88c;
          palVar42 = (__m256i *)local_ac0;
          local_2c0 = local_14c0;
          local_2c8 = local_17c0;
          local_2d0 = (undefined8 *)&stack0xffffffffffffe640;
          local_2d8 = local_1540;
          local_180 = src + local_2b0 * 7;
          auVar44._8_8_ = uStack_13f8;
          auVar44._0_8_ = local_1400;
          auVar44._16_8_ = uStack_13f0;
          auVar44._24_8_ = uStack_13e8;
          local_260 = local_13e0;
          uStack_258 = uStack_13d8;
          uStack_250 = uStack_13d0;
          uStack_248 = uStack_13c8;
          auVar21._8_8_ = uStack_13d8;
          auVar21._0_8_ = local_13e0;
          auVar21._16_8_ = uStack_13d0;
          auVar21._24_8_ = uStack_13c8;
          local_1760 = vpunpcklwd_avx2(auVar44,auVar21);
          auVar26._8_8_ = uStack_13f8;
          auVar26._0_8_ = local_1400;
          auVar26._16_8_ = uStack_13f0;
          auVar26._24_8_ = uStack_13e8;
          local_1e0 = local_13e0;
          uStack_1d8 = uStack_13d8;
          uStack_1d0 = uStack_13d0;
          uStack_1c8 = uStack_13c8;
          auVar27._8_8_ = uStack_13d8;
          auVar27._0_8_ = local_13e0;
          auVar27._16_8_ = uStack_13d0;
          auVar27._24_8_ = uStack_13c8;
          local_16e0 = vpunpckhwd_avx2(auVar26,auVar27);
          local_188 = (undefined1 (*) [32])(src + local_2b0 * 8);
          local_2a0 = *(undefined8 *)*local_188;
          uStack_298 = *(undefined8 *)(*local_188 + 8);
          uStack_290 = *(undefined8 *)(*local_188 + 0x10);
          uStack_288 = *(undefined8 *)(*local_188 + 0x18);
          local_280 = local_13e0;
          uStack_278 = uStack_13d8;
          uStack_270 = uStack_13d0;
          uStack_268 = uStack_13c8;
          auVar32._8_8_ = uStack_13d8;
          auVar32._0_8_ = local_13e0;
          auVar32._16_8_ = uStack_13d0;
          auVar32._24_8_ = uStack_13c8;
          vpunpcklwd_avx2(auVar32,*local_188);
          local_220 = local_1400;
          uStack_218 = uStack_13f8;
          uStack_210 = uStack_13f0;
          uStack_208 = uStack_13e8;
          auVar35._8_8_ = uStack_13f8;
          auVar35._0_8_ = local_1400;
          auVar35._16_8_ = uStack_13f0;
          auVar35._24_8_ = uStack_13e8;
          local_200 = local_13e0;
          uStack_1f8 = uStack_13d8;
          uStack_1f0 = uStack_13d0;
          uStack_1e8 = uStack_13c8;
          auVar36._8_8_ = uStack_13d8;
          auVar36._0_8_ = local_13e0;
          auVar36._16_8_ = uStack_13d0;
          auVar36._24_8_ = uStack_13c8;
          vpunpckhwd_avx2(auVar36,auVar35);
          local_2b8 = palVar42;
          local_2a8 = src;
          local_13e0 = *(undefined8 *)local_180;
          uStack_13d8 = *(undefined8 *)(local_180 + 4);
          uStack_13d0 = *(undefined8 *)(local_180 + 8);
          uStack_13c8 = *(undefined8 *)(local_180 + 0xc);
          local_1400 = local_2a0;
          uStack_13f8 = uStack_298;
          uStack_13f0 = uStack_290;
          uStack_13e8 = uStack_288;
          xy_y_convolve_8tap_16_avx2(palVar42,in_stack_ffffffffffffe620,(__m256i *)0x9b093d);
          xy_y_convolve_8tap_16_avx2(palVar42,in_stack_ffffffffffffe620,(__m256i *)0x9b095e);
          puVar41 = local_2c8;
          puVar1 = local_2c8 + 5;
          uVar2 = local_2c8[6];
          uVar3 = local_2c8[7];
          in_stack_ffffffffffffe628 = palVar42;
          *local_2c8 = local_2c8[4];
          puVar41[1] = *puVar1;
          puVar41[2] = uVar2;
          puVar41[3] = uVar3;
          puVar41 = local_2c8;
          puVar1 = local_2c8 + 9;
          uVar2 = local_2c8[10];
          uVar3 = local_2c8[0xb];
          local_2c8[4] = local_2c8[8];
          puVar41[5] = *puVar1;
          puVar41[6] = uVar2;
          puVar41[7] = uVar3;
          puVar41 = local_2c8;
          puVar1 = local_2c8 + 0xd;
          uVar2 = local_2c8[0xe];
          uVar3 = local_2c8[0xf];
          local_2c8[8] = local_2c8[0xc];
          puVar41[9] = *puVar1;
          puVar41[10] = uVar2;
          puVar41[0xb] = uVar3;
          puVar41 = local_2c8;
          puVar1 = local_2c8 + 0x15;
          uVar2 = local_2c8[0x16];
          uVar3 = local_2c8[0x17];
          local_2c8[0x10] = local_2c8[0x14];
          puVar41[0x11] = *puVar1;
          puVar41[0x12] = uVar2;
          puVar41[0x13] = uVar3;
          puVar41 = local_2c8;
          puVar1 = local_2c8 + 0x19;
          uVar2 = local_2c8[0x1a];
          uVar3 = local_2c8[0x1b];
          local_2c8[0x14] = local_2c8[0x18];
          puVar41[0x15] = *puVar1;
          puVar41[0x16] = uVar2;
          puVar41[0x17] = uVar3;
          puVar41 = local_2c8;
          puVar1 = local_2c8 + 0x1d;
          uVar2 = local_2c8[0x1e];
          uVar3 = local_2c8[0x1f];
          local_2c8[0x18] = local_2c8[0x1c];
          puVar41[0x19] = *puVar1;
          puVar41[0x1a] = uVar2;
          puVar41[0x1b] = uVar3;
          puVar41 = local_2d0;
          puVar1 = local_2d0 + 5;
          uVar2 = local_2d0[6];
          uVar3 = local_2d0[7];
          *local_2d0 = local_2d0[4];
          puVar41[1] = *puVar1;
          puVar41[2] = uVar2;
          puVar41[3] = uVar3;
          puVar41 = local_2d0;
          puVar1 = local_2d0 + 9;
          uVar2 = local_2d0[10];
          uVar3 = local_2d0[0xb];
          local_2d0[4] = local_2d0[8];
          puVar41[5] = *puVar1;
          puVar41[6] = uVar2;
          puVar41[7] = uVar3;
          puVar41 = local_2d0;
          puVar1 = local_2d0 + 0xd;
          uVar2 = local_2d0[0xe];
          uVar3 = local_2d0[0xf];
          local_2d0[8] = local_2d0[0xc];
          puVar41[9] = *puVar1;
          puVar41[10] = uVar2;
          puVar41[0xb] = uVar3;
          puVar41 = local_2d0;
          puVar1 = local_2d0 + 0x15;
          uVar2 = local_2d0[0x16];
          uVar3 = local_2d0[0x17];
          local_2d0[0x10] = local_2d0[0x14];
          puVar41[0x11] = *puVar1;
          puVar41[0x12] = uVar2;
          puVar41[0x13] = uVar3;
          puVar41 = local_2d0;
          puVar1 = local_2d0 + 0x19;
          uVar2 = local_2d0[0x1a];
          uVar3 = local_2d0[0x1b];
          local_2d0[0x14] = local_2d0[0x18];
          puVar41[0x15] = *puVar1;
          puVar41[0x16] = uVar2;
          puVar41[0x17] = uVar3;
          puVar41 = local_2d0;
          puVar1 = local_2d0 + 0x1d;
          uVar2 = local_2d0[0x1e];
          uVar3 = local_2d0[0x1f];
          local_2d0[0x18] = local_2d0[0x1c];
          puVar41[0x19] = *puVar1;
          puVar41[0x1a] = uVar2;
          puVar41[0x1b] = uVar3;
          local_408 = src + 0x10;
          local_410 = (long)local_88c;
          local_420 = local_13c0;
          local_428 = local_16c0;
          local_430 = (undefined8 *)&stack0xffffffffffffe740;
          local_438 = local_15c0;
          local_2e0 = local_408 + local_410 * 7;
          auVar22._8_8_ = uStack_12f8;
          auVar22._0_8_ = local_1300;
          auVar22._16_8_ = uStack_12f0;
          auVar22._24_8_ = uStack_12e8;
          local_3c0 = local_12e0;
          uStack_3b8 = uStack_12d8;
          uStack_3b0 = uStack_12d0;
          uStack_3a8 = uStack_12c8;
          auVar23._8_8_ = uStack_12d8;
          auVar23._0_8_ = local_12e0;
          auVar23._16_8_ = uStack_12d0;
          auVar23._24_8_ = uStack_12c8;
          local_1660 = vpunpcklwd_avx2(auVar22,auVar23);
          auVar28._8_8_ = uStack_12f8;
          auVar28._0_8_ = local_1300;
          auVar28._16_8_ = uStack_12f0;
          auVar28._24_8_ = uStack_12e8;
          local_340 = local_12e0;
          uStack_338 = uStack_12d8;
          uStack_330 = uStack_12d0;
          uStack_328 = uStack_12c8;
          auVar29._8_8_ = uStack_12d8;
          auVar29._0_8_ = local_12e0;
          auVar29._16_8_ = uStack_12d0;
          auVar29._24_8_ = uStack_12c8;
          local_15e0 = vpunpckhwd_avx2(auVar28,auVar29);
          local_2e8 = (undefined1 (*) [32])(local_408 + local_410 * 8);
          local_400 = *(undefined8 *)*local_2e8;
          uStack_3f8 = *(undefined8 *)(*local_2e8 + 8);
          uStack_3f0 = *(undefined8 *)(*local_2e8 + 0x10);
          uStack_3e8 = *(undefined8 *)(*local_2e8 + 0x18);
          local_3e0 = local_12e0;
          uStack_3d8 = uStack_12d8;
          uStack_3d0 = uStack_12d0;
          uStack_3c8 = uStack_12c8;
          auVar33._8_8_ = uStack_12d8;
          auVar33._0_8_ = local_12e0;
          auVar33._16_8_ = uStack_12d0;
          auVar33._24_8_ = uStack_12c8;
          vpunpcklwd_avx2(auVar33,*local_2e8);
          local_380 = local_1300;
          uStack_378 = uStack_12f8;
          uStack_370 = uStack_12f0;
          uStack_368 = uStack_12e8;
          auVar37._8_8_ = uStack_12f8;
          auVar37._0_8_ = local_1300;
          auVar37._16_8_ = uStack_12f0;
          auVar37._24_8_ = uStack_12e8;
          local_360 = local_12e0;
          uStack_358 = uStack_12d8;
          uStack_350 = uStack_12d0;
          uStack_348 = uStack_12c8;
          auVar38._8_8_ = uStack_12d8;
          auVar38._0_8_ = local_12e0;
          auVar38._16_8_ = uStack_12d0;
          auVar38._24_8_ = uStack_12c8;
          vpunpckhwd_avx2(auVar38,auVar37);
          local_418 = palVar42;
          local_12e0 = *(undefined8 *)local_2e0;
          uStack_12d8 = *(undefined8 *)(local_2e0 + 4);
          uStack_12d0 = *(undefined8 *)(local_2e0 + 8);
          uStack_12c8 = *(undefined8 *)(local_2e0 + 0xc);
          local_1300 = local_400;
          uStack_12f8 = uStack_3f8;
          uStack_12f0 = uStack_3f0;
          uStack_12e8 = uStack_3e8;
          xy_y_convolve_8tap_16_avx2
                    (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,(__m256i *)0x9b0c9f);
          xy_y_convolve_8tap_16_avx2
                    (in_stack_ffffffffffffe628,in_stack_ffffffffffffe620,(__m256i *)0x9b0cc0);
          puVar41 = local_428;
          puVar1 = local_428 + 5;
          uVar2 = local_428[6];
          uVar3 = local_428[7];
          *local_428 = local_428[4];
          puVar41[1] = *puVar1;
          puVar41[2] = uVar2;
          puVar41[3] = uVar3;
          puVar41 = local_428;
          puVar1 = local_428 + 9;
          uVar2 = local_428[10];
          uVar3 = local_428[0xb];
          local_428[4] = local_428[8];
          puVar41[5] = *puVar1;
          puVar41[6] = uVar2;
          puVar41[7] = uVar3;
          puVar41 = local_428;
          puVar1 = local_428 + 0xd;
          uVar2 = local_428[0xe];
          uVar3 = local_428[0xf];
          local_428[8] = local_428[0xc];
          puVar41[9] = *puVar1;
          puVar41[10] = uVar2;
          puVar41[0xb] = uVar3;
          puVar41 = local_428;
          puVar1 = local_428 + 0x15;
          uVar2 = local_428[0x16];
          uVar3 = local_428[0x17];
          local_428[0x10] = local_428[0x14];
          puVar41[0x11] = *puVar1;
          puVar41[0x12] = uVar2;
          puVar41[0x13] = uVar3;
          puVar41 = local_428;
          puVar1 = local_428 + 0x19;
          uVar2 = local_428[0x1a];
          uVar3 = local_428[0x1b];
          local_428[0x14] = local_428[0x18];
          puVar41[0x15] = *puVar1;
          puVar41[0x16] = uVar2;
          puVar41[0x17] = uVar3;
          puVar41 = local_428;
          puVar1 = local_428 + 0x1d;
          uVar2 = local_428[0x1e];
          uVar3 = local_428[0x1f];
          local_428[0x18] = local_428[0x1c];
          puVar41[0x19] = *puVar1;
          puVar41[0x1a] = uVar2;
          puVar41[0x1b] = uVar3;
          puVar41 = local_430;
          puVar1 = local_430 + 5;
          uVar2 = local_430[6];
          uVar3 = local_430[7];
          *local_430 = local_430[4];
          puVar41[1] = *puVar1;
          puVar41[2] = uVar2;
          puVar41[3] = uVar3;
          puVar41 = local_430;
          puVar1 = local_430 + 9;
          uVar2 = local_430[10];
          uVar3 = local_430[0xb];
          local_430[4] = local_430[8];
          puVar41[5] = *puVar1;
          puVar41[6] = uVar2;
          puVar41[7] = uVar3;
          puVar41 = local_430;
          puVar1 = local_430 + 0xd;
          uVar2 = local_430[0xe];
          uVar3 = local_430[0xf];
          local_430[8] = local_430[0xc];
          puVar41[9] = *puVar1;
          puVar41[10] = uVar2;
          puVar41[0xb] = uVar3;
          puVar41 = local_430;
          puVar1 = local_430 + 0x15;
          uVar2 = local_430[0x16];
          uVar3 = local_430[0x17];
          local_430[0x10] = local_430[0x14];
          puVar41[0x11] = *puVar1;
          puVar41[0x12] = uVar2;
          puVar41[0x13] = uVar3;
          puVar41 = local_430;
          puVar1 = local_430 + 0x19;
          uVar2 = local_430[0x1a];
          uVar3 = local_430[0x1b];
          local_430[0x14] = local_430[0x18];
          puVar41[0x15] = *puVar1;
          puVar41[0x16] = uVar2;
          puVar41[0x17] = uVar3;
          puVar41 = local_430;
          puVar1 = local_430 + 0x1d;
          uVar2 = local_430[0x1e];
          uVar3 = local_430[0x1f];
          local_430[0x18] = local_430[0x1c];
          puVar41[0x19] = *puVar1;
          puVar41[0x1a] = uVar2;
          puVar41[0x1b] = uVar3;
          xy_y_round_store_32_avx2
                    (in_stack_ffffffffffffe680,in_stack_ffffffffffffe678,
                     (uint8_t *)in_stack_ffffffffffffe670);
          xy_y_round_store_32_avx2
                    (in_stack_ffffffffffffe680,in_stack_ffffffffffffe678,
                     (uint8_t *)in_stack_ffffffffffffe670);
          src = src + (local_88c << 1);
          local_8b4 = local_8b4 + -2;
        } while (local_8b4 != 0);
        local_12a4 = local_12a4 + 0x20;
        local_8b4 = 0;
      } while (local_12a4 < local_88c);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_8tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y;

  if (w == 2) {
    __m128i coeffs_128[4], s_32[8], ss_128[4];

    prepare_coeffs_8tap_sse2(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));
    s_32[3] = _mm_cvtsi32_si128(*(int32_t *)(im + 3 * 2));
    s_32[4] = _mm_cvtsi32_si128(*(int32_t *)(im + 4 * 2));
    s_32[5] = _mm_cvtsi32_si128(*(int32_t *)(im + 5 * 2));
    s_32[6] = _mm_cvtsi32_si128(*(int32_t *)(im + 6 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);
    const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
    const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[4]);
    const __m128i src45 = _mm_unpacklo_epi32(s_32[4], s_32[5]);
    const __m128i src56 = _mm_unpacklo_epi32(s_32[5], s_32[6]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);
    ss_128[1] = _mm_unpacklo_epi16(src23, src34);
    ss_128[2] = _mm_unpacklo_epi16(src45, src56);

    y = h;
    do {
      const __m128i res =
          xy_y_convolve_8tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[4];

    prepare_coeffs_8tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[8];
      __m256i s_256[8], ss_256[4];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));
      s_64[3] = _mm_loadl_epi64((__m128i *)(im + 3 * 4));
      s_64[4] = _mm_loadl_epi64((__m128i *)(im + 4 * 4));
      s_64[5] = _mm_loadl_epi64((__m128i *)(im + 5 * 4));
      s_64[6] = _mm_loadl_epi64((__m128i *)(im + 6 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);
      s_256[2] = _mm256_setr_m128i(s_64[2], s_64[3]);
      s_256[3] = _mm256_setr_m128i(s_64[3], s_64[4]);
      s_256[4] = _mm256_setr_m128i(s_64[4], s_64[5]);
      s_256[5] = _mm256_setr_m128i(s_64[5], s_64[6]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
      ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
      ss_256[2] = _mm256_unpacklo_epi16(s_256[4], s_256[5]);

      y = h;
      do {
        const __m256i res =
            xy_y_convolve_8tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[8], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 8));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 8));
      s_256[4] = _mm256_loadu_si256((__m256i *)(im + 4 * 8));
      s_256[5] = _mm256_loadu_si256((__m256i *)(im + 5 * 8));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);

        do {
          xy_y_convolve_8tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[8], r[4];

      load_16bit_7rows_avx2(im, 16, s_256);
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8], tt_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);
        convolve_8tap_unpack_avx2(s_256 + 1, tt_256);

        do {
          xy_y_convolve_8tap_16x2_avx2(im, 16, coeffs_256, s_256, ss_256,
                                       tt_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_16x2_half_pel_avx2(im, 16, coeffs_256, s_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      int32_t x = 0;
      __m256i s_256[2][8], r0[4], r1[4];

      assert(!(w % 32));

      __m256i ss_256[2][8], tt_256[2][8];

      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        load_16bit_7rows_avx2(s, w, s_256[0]);
        convolve_8tap_unpack_avx2(s_256[0], ss_256[0]);
        convolve_8tap_unpack_avx2(s_256[0] + 1, tt_256[0]);

        load_16bit_7rows_avx2(s + 16, w, s_256[1]);
        convolve_8tap_unpack_avx2(s_256[1], ss_256[1]);
        convolve_8tap_unpack_avx2(s_256[1] + 1, tt_256[1]);

        y = h;
        do {
          xy_y_convolve_8tap_16x2_avx2(s, w, coeffs_256, s_256[0], ss_256[0],
                                       tt_256[0], r0);
          xy_y_convolve_8tap_16x2_avx2(s + 16, w, coeffs_256, s_256[1],
                                       ss_256[1], tt_256[1], r1);
          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}